

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_Predict(ARKodeMem ark_mem,int istage,N_Vector yguess)

{
  double *pdVar1;
  double dVar2;
  void *pvVar3;
  long lVar4;
  sunrealtype *cvals;
  N_Vector *Xvecs;
  int iVar5;
  uint nvec;
  ulong uVar6;
  long lVar7;
  char *msgfmt;
  ulong uVar8;
  bool bVar9;
  double tau;
  double dVar10;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    ark_mem = (ARKodeMem)0x0;
    iVar5 = 0xf53;
LAB_00158fb5:
    arkProcessError(ark_mem,-0x15,iVar5,"mriStep_Predict",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,msgfmt);
    return -0x15;
  }
  if ((ark_mem->interp == (ARKInterp)0x0) && (0 < *(int *)((long)pvVar3 + 0xe0))) {
    msgfmt = "Interpolation structure is NULL";
    iVar5 = 0xf5c;
    goto LAB_00158fb5;
  }
  if ((ark_mem->initsetup != 0) || (3 < *(int *)((long)pvVar3 + 0xe0) - 1U)) goto LAB_00158f42;
  lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x48) + 0x18);
  dVar2 = ark_mem->h;
  tau = *(double *)(lVar4 + (long)istage * 8) * dVar2;
  dVar10 = tau / ark_mem->hold;
  switch(*(int *)((long)pvVar3 + 0xe0)) {
  case 1:
    iVar5 = arkPredict_MaximumOrder(ark_mem,dVar10,yguess);
    break;
  case 2:
    iVar5 = arkPredict_VariableOrder(ark_mem,dVar10,yguess);
    break;
  case 3:
    iVar5 = arkPredict_CutoffOrder(ark_mem,dVar10,yguess);
    break;
  case 4:
    if (istage < 1) goto LAB_00158f42;
    cvals = *(sunrealtype **)((long)pvVar3 + 0x1f8);
    Xvecs = *(N_Vector **)((long)pvVar3 + 0x200);
    uVar6 = 0xffffffff;
    uVar8 = 0;
    do {
      pdVar1 = (double *)(lVar4 + uVar8 * 8);
      if (*pdVar1 != 0.0) {
        uVar6 = uVar8 & 0xffffffff;
      }
      if (NAN(*pdVar1)) {
        uVar6 = uVar8 & 0xffffffff;
      }
      iVar5 = (int)uVar6;
      uVar8 = uVar8 + 1;
    } while ((uint)istage != uVar8);
    if (iVar5 == -1) goto LAB_00158f42;
    if (0 < istage) {
      uVar8 = 0;
      do {
        dVar10 = *(double *)(lVar4 + uVar8 * 8);
        if ((((dVar10 != 0.0) || (NAN(dVar10))) &&
            (pdVar1 = (double *)(lVar4 + (long)(int)uVar6 * 8),
            *pdVar1 <= dVar10 && dVar10 != *pdVar1)) &&
           (-1 < *(int *)(*(long *)((long)pvVar3 + 0x68) + uVar8 * 4))) {
          uVar6 = uVar8 & 0xffffffff;
        }
        iVar5 = (int)uVar6;
        uVar8 = uVar8 + 1;
      } while ((uint)istage != uVar8);
    }
    lVar7 = (long)iVar5;
    dVar10 = *(double *)(lVar4 + lVar7 * 8);
    bVar9 = *(int *)((long)pvVar3 + 0x1c) != 0;
    if (bVar9) {
      *cvals = 1.0;
      *Xvecs = *(N_Vector *)
                (*(long *)((long)pvVar3 + 0x30) +
                (long)*(int *)(*(long *)((long)pvVar3 + 0x68) + lVar7 * 4) * 8);
    }
    nvec = (uint)bVar9;
    if (*(int *)((long)pvVar3 + 0x18) != 0) {
      *(undefined8 *)((long)cvals + (ulong)(nvec * 8)) = 0x3ff0000000000000;
      *(undefined8 *)((long)Xvecs + (ulong)(nvec * 8)) =
           *(undefined8 *)
            (*(long *)((long)pvVar3 + 0x28) +
            (long)*(int *)(*(long *)((long)pvVar3 + 0x68) + lVar7 * 4) * 8);
      nvec = nvec + 1;
    }
    iVar5 = arkPredict_Bootstrap(ark_mem,dVar2 * dVar10,tau,nvec,cvals,Xvecs,yguess);
  }
  if (iVar5 != -0x16) {
    return iVar5;
  }
LAB_00158f42:
  N_VScale(0x3ff0000000000000,ark_mem->yn,yguess);
  return 0;
}

Assistant:

int mriStep_Predict(ARKodeMem ark_mem, int istage, N_Vector yguess)
{
  int i, retval, jstage, nvec;
  sunrealtype tau;
  sunrealtype h;
  ARKodeMRIStepMem step_mem;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

  /* verify that interpolation structure is provided */
  if ((ark_mem->interp == NULL) && (step_mem->predictor > 0))
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "Interpolation structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* if the first step (or if resized), use initial condition as guess */
  if (ark_mem->initsetup)
  {
    N_VScale(ONE, ark_mem->yn, yguess);
    return (ARK_SUCCESS);
  }

  /* set evaluation time tau as relative shift from previous successful time */
  tau = step_mem->MRIC->c[istage] * ark_mem->h / ark_mem->hold;

  /* use requested predictor formula */
  switch (step_mem->predictor)
  {
  case 1:

    /***** Interpolatory Predictor 1 -- all to max order *****/
    retval = arkPredict_MaximumOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT) { return (retval); }
    break;

  case 2:

    /***** Interpolatory Predictor 2 -- decrease order w/ increasing level of extrapolation *****/
    retval = arkPredict_VariableOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT) { return (retval); }
    break;

  case 3:

    /***** Cutoff predictor: max order interpolatory output for stages "close"
           to previous step, first-order predictor for subsequent stages *****/
    retval = arkPredict_CutoffOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT) { return (retval); }
    break;

  case 4:

    /***** Bootstrap predictor: if any previous stage in step has nonzero c_i,
           construct a quadratic Hermite interpolant for prediction; otherwise
           use the trivial predictor.  The actual calculations are performed in
           arkPredict_Bootstrap, but here we need to determine the appropriate
           stage, c_j, to use. *****/

    /* determine if any previous stages in step meet criteria */
    jstage = -1;
    for (i = 0; i < istage; i++)
    {
      jstage = (step_mem->MRIC->c[i] != ZERO) ? i : jstage;
    }

    /* if using the trivial predictor, break */
    if (jstage == -1) { break; }

    /* find the "optimal" previous stage to use */
    for (i = 0; i < istage; i++)
    {
      if ((step_mem->MRIC->c[i] > step_mem->MRIC->c[jstage]) &&
          (step_mem->MRIC->c[i] != ZERO) && step_mem->stage_map[i] > -1)
      {
        jstage = i;
      }
    }

    /* set stage time, stage RHS and interpolation values */
    h    = ark_mem->h * step_mem->MRIC->c[jstage];
    tau  = ark_mem->h * step_mem->MRIC->c[istage];
    nvec = 0;
    if (step_mem->implicit_rhs)
    { /* Implicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[jstage]];
      nvec += 1;
    }
    if (step_mem->explicit_rhs)
    { /* Explicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[jstage]];
      nvec += 1;
    }

    /* call predictor routine */
    retval = arkPredict_Bootstrap(ark_mem, h, tau, nvec, cvals, Xvecs, yguess);
    if (retval != ARK_ILL_INPUT) { return (retval); }
    break;
  }

  /* if we made it here, use the trivial predictor (previous step solution) */
  N_VScale(ONE, ark_mem->yn, yguess);
  return (ARK_SUCCESS);
}